

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O0

void kws_search_free(ps_search_t *search)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  char *ptr;
  long lVar4;
  double dVar5;
  kws_keyphrase_t *keyphrase;
  gnode_t *gn;
  double n_speech;
  kws_search_t *kwss;
  ps_search_t *search_local;
  
  iVar3 = *(int *)&search[2].type;
  lVar4 = ps_config_int(search->config,"frate");
  dVar5 = (double)iVar3 / (double)lVar4;
  uVar1._0_4_ = search[1].post;
  uVar1._4_4_ = search[1].n_words;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
          ,0x1c8,"TOTAL kws %.2f CPU %.3f xRT\n",uVar1,*(double *)&search[1].post / dVar5);
  uVar2._0_4_ = search[1].start_wid;
  uVar2._4_4_ = search[1].silence_wid;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
          ,0x1cb,"TOTAL kws %.2f wall %.3f xRT\n",uVar2,*(double *)&search[1].start_wid / dVar5);
  ps_search_base_free(search);
  hmm_context_free((hmm_context_t *)search[1].vt);
  kws_detections_reset((kws_detections_t *)search[1].name);
  ckd_free(search[1].name);
  ckd_free(search[1].d2p);
  for (keyphrase = (kws_keyphrase_t *)search[1].type; keyphrase != (kws_keyphrase_t *)0x0;
      keyphrase = *(kws_keyphrase_t **)&keyphrase->threshold) {
    ptr = keyphrase->word;
    ckd_free(*(void **)(ptr + 0x10));
    ckd_free(*(void **)ptr);
    ckd_free(ptr);
  }
  glist_free((glist_t)search[1].type);
  ckd_free(search);
  return;
}

Assistant:

void
kws_search_free(ps_search_t * search)
{
    kws_search_t *kwss;
    double n_speech;
    gnode_t *gn;

    kwss = (kws_search_t *) search;

    n_speech = (double)kwss->n_tot_frame
        / ps_config_int(ps_search_config(kwss), "frate");

    E_INFO("TOTAL kws %.2f CPU %.3f xRT\n",
           kwss->perf.t_tot_cpu,
           kwss->perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL kws %.2f wall %.3f xRT\n",
           kwss->perf.t_tot_elapsed,
           kwss->perf.t_tot_elapsed / n_speech);


    ps_search_base_free(search);
    hmm_context_free(kwss->hmmctx);
    kws_detections_reset(kwss->detections);
    ckd_free(kwss->detections);

    ckd_free(kwss->pl_hmms);
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn)) {
	kws_keyphrase_t *keyphrase = gnode_ptr(gn);
        ckd_free(keyphrase->hmms);
        ckd_free(keyphrase->word);
        ckd_free(keyphrase);
    }
    glist_free(kwss->keyphrases);
    ckd_free(kwss);
}